

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O0

void __thiscall gvr::MultiTexturedMesh::loadPLY(MultiTexturedMesh *this,PLYReader *ply)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ply_type pVar4;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  PLYReader *in_RSI;
  Mesh *in_RDI;
  MultiTextureIndexReceiver ti;
  MultiTextureCoordReceiver tc;
  TriangleReceiver tr;
  int tn;
  FloatArrayReceiver nz;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sz;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver sc;
  FloatArrayReceiver se;
  FloatArrayReceiver ss;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  FloatArrayReceiver vx;
  string s;
  size_t k;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  size_t j;
  int vn;
  MultiTexturedMesh *in_stack_fffffffffffff1e8;
  undefined4 in_stack_fffffffffffff1f0;
  uint uVar10;
  ply_type in_stack_fffffffffffff1f4;
  PLYReader *in_stack_fffffffffffff1f8;
  allocator *paVar11;
  PLYReader *in_stack_fffffffffffff200;
  PLYReader *in_stack_fffffffffffff208;
  PLYReader *this_00;
  undefined4 in_stack_fffffffffffff210;
  undefined4 in_stack_fffffffffffff214;
  bool local_dcd;
  PLYReader *this_01;
  PLYReader *in_stack_fffffffffffff428;
  Model *in_stack_fffffffffffff430;
  bool local_b5d;
  bool local_af5;
  allocator local_a81;
  string local_a80 [37];
  byte local_a5b;
  byte local_a5a;
  undefined1 local_a59 [38];
  byte local_a33;
  byte local_a32;
  allocator local_a31;
  string local_a30 [37];
  byte local_a0b;
  byte local_a0a;
  allocator local_a09;
  string local_a08 [39];
  allocator local_9e1;
  string local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [39];
  allocator local_991;
  string local_990 [39];
  allocator local_969;
  string local_968 [39];
  allocator local_941;
  string local_940 [39];
  allocator local_919;
  string local_918 [71];
  allocator local_8d1;
  string local_8d0 [39];
  allocator local_8a9;
  string local_8a8 [39];
  allocator local_881;
  string local_880 [39];
  allocator local_859;
  string local_858 [55];
  allocator local_821;
  string local_820 [32];
  undefined4 local_800;
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [39];
  allocator local_7a9;
  string local_7a8 [39];
  allocator local_781;
  string local_780 [39];
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [135];
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [135];
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [135];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [133];
  byte local_2bb;
  byte local_2ba;
  allocator local_2b9;
  string local_2b8 [37];
  byte local_293;
  byte local_292;
  allocator local_291;
  string local_290 [37];
  byte local_26b;
  byte local_26a;
  allocator local_269;
  string local_268 [37];
  byte local_243;
  byte local_242;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [37];
  byte local_1cb;
  byte local_1ca;
  allocator local_1c9;
  string local_1c8 [37];
  byte local_1a3;
  byte local_1a2;
  allocator local_1a1;
  string local_1a0 [37];
  byte local_17b;
  byte local_17a;
  allocator local_179;
  string local_178 [37];
  byte local_153;
  byte local_152;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  long local_a0;
  ulong local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_78 [32];
  long local_58;
  allocator local_39;
  string local_38 [36];
  uint local_14;
  PLYReader *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"vertex",&local_39);
  lVar5 = PLYReader::instancesOfElement
                    (in_stack_fffffffffffff1f8,
                     (string *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = (uint)lVar5;
  Model::setOriginFromPLY(in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  pcVar6 = PLYReader::getName((PLYReader *)0x153e12);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),pcVar6);
  local_58 = std::__cxx11::string::find_last_of((char *)(in_RDI + 1),0x15ca40);
  if (local_58 == -1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 1),"");
  }
  else {
    std::__cxx11::string::substr((ulong)local_78,(ulong)(in_RDI + 1));
    std::__cxx11::string::operator=((string *)(in_RDI + 1),local_78);
    std::__cxx11::string::~string(local_78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x153f32);
  PLYReader::getComments
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff208);
  (*(in_RDI->super_PointCloud).super_Model._vptr_Model[0xb])(in_RDI,0);
  for (local_98 = 0; uVar9 = local_98,
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_90), uVar10 = local_14, uVar9 < sVar7; local_98 = local_98 + 1) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_90,local_98);
    local_a0 = std::__cxx11::string::find((char *)pvVar8,0x15ca28);
    if (local_a0 != 0) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_90,local_98);
      local_a0 = std::__cxx11::string::find((char *)pvVar8,0x15ca34);
    }
    if (local_a0 == 0) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_90,local_98);
      std::__cxx11::string::substr((ulong)local_c0,(ulong)pvVar8);
      gutil::trim(local_c0);
      iVar3 = getTextureCount((MultiTexturedMesh *)0x15407f);
      (*(in_RDI->super_PointCloud).super_Model._vptr_Model[0xb])(in_RDI,(ulong)(iVar3 + 1));
      getTextureCount((MultiTexturedMesh *)0x1540b1);
      std::__cxx11::string::string(local_e0,local_c0);
      setTextureName((MultiTexturedMesh *)in_stack_fffffffffffff200,
                     (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),
                     (string *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
    }
  }
  std::allocator<char>::allocator();
  local_152 = 0;
  local_153 = 0;
  local_17a = 0;
  local_17b = 0;
  local_1a2 = 0;
  local_1a3 = 0;
  local_1ca = 0;
  local_1cb = 0;
  std::__cxx11::string::string(local_100,"vertex",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"scan_size",&local_129);
  pVar4 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                     &in_stack_fffffffffffff1f8->filename);
  local_af5 = true;
  if (pVar4 == ply_none) {
    std::allocator<char>::allocator();
    local_152 = 1;
    std::__cxx11::string::string(local_150,"vertex",&local_151);
    local_153 = 1;
    std::allocator<char>::allocator();
    local_17a = 1;
    std::__cxx11::string::string(local_178,"scan_error",&local_179);
    local_17b = 1;
    pVar4 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                       &in_stack_fffffffffffff1f8->filename);
    local_af5 = true;
    if (pVar4 == ply_none) {
      std::allocator<char>::allocator();
      local_1a2 = 1;
      std::__cxx11::string::string(local_1a0,"vertex",&local_1a1);
      local_1a3 = 1;
      std::allocator<char>::allocator();
      local_1ca = 1;
      std::__cxx11::string::string(local_1c8,"scan_conf",&local_1c9);
      local_1cb = 1;
      pVar4 = PLYReader::getTypeOfProperty
                        (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                         &in_stack_fffffffffffff1f8->filename);
      local_af5 = pVar4 != ply_none;
    }
  }
  std::allocator<char>::allocator();
  local_242 = 0;
  local_243 = 0;
  local_26a = 0;
  local_26b = 0;
  local_292 = 0;
  local_293 = 0;
  local_2ba = 0;
  local_2bb = 0;
  std::__cxx11::string::string(local_1f0,"vertex",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"sx",&local_219);
  pVar4 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                     &in_stack_fffffffffffff1f8->filename);
  local_b5d = false;
  if (pVar4 != ply_none) {
    std::allocator<char>::allocator();
    local_242 = 1;
    std::__cxx11::string::string(local_240,"vertex",&local_241);
    local_243 = 1;
    std::allocator<char>::allocator();
    local_26a = 1;
    std::__cxx11::string::string(local_268,"sy",&local_269);
    local_26b = 1;
    pVar4 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                       &in_stack_fffffffffffff1f8->filename);
    local_b5d = false;
    if (pVar4 != ply_none) {
      std::allocator<char>::allocator();
      local_292 = 1;
      std::__cxx11::string::string(local_290,"vertex",&local_291);
      local_293 = 1;
      std::allocator<char>::allocator();
      local_2ba = 1;
      std::__cxx11::string::string(local_2b8,"sz",&local_2b9);
      local_2bb = 1;
      pVar4 = PLYReader::getTypeOfProperty
                        (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                         &in_stack_fffffffffffff1f8->filename);
      local_b5d = pVar4 != ply_none;
    }
  }
  (*(in_RDI->super_PointCloud).super_Model._vptr_Model[9])
            (in_RDI,(ulong)uVar10,(ulong)local_af5,(ulong)local_b5d);
  if ((local_2bb & 1) != 0) {
    std::__cxx11::string::~string(local_2b8);
  }
  if ((local_2ba & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  if ((local_293 & 1) != 0) {
    std::__cxx11::string::~string(local_290);
  }
  if ((local_292 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
  }
  if ((local_26b & 1) != 0) {
    std::__cxx11::string::~string(local_268);
  }
  if ((local_26a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  if ((local_243 & 1) != 0) {
    std::__cxx11::string::~string(local_240);
  }
  if ((local_242 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
  }
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  if ((local_1cb & 1) != 0) {
    std::__cxx11::string::~string(local_1c8);
  }
  if ((local_1ca & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  if ((local_1a3 & 1) != 0) {
    std::__cxx11::string::~string(local_1a0);
  }
  if ((local_1a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  if ((local_17b & 1) != 0) {
    std::__cxx11::string::~string(local_178);
  }
  if ((local_17a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
  }
  if ((local_153 & 1) != 0) {
    std::__cxx11::string::~string(local_150);
  }
  if ((local_152 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"vertex",&local_341);
  paVar11 = &local_369;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"x",paVar11);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  paVar11 = &local_391;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"vertex",paVar11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"y",&local_3b9);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"vertex",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"z",&local_409);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  bVar2 = PointCloud::hasScanProp(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"vertex",&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b8,"scan_size",&local_4b9);
    PLYReader::setReceiver
              (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
               &in_stack_fffffffffffff1f8->filename,
               (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e0,"vertex",&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"scan_error",&local_509);
    PLYReader::setReceiver
              (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
               &in_stack_fffffffffffff1f8->filename,
               (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"vertex",&local_531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_558,"scan_conf",&local_559);
    PLYReader::setReceiver
              (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
               &in_stack_fffffffffffff1f8->filename,
               (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
    std::__cxx11::string::~string(local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
  }
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  bVar2 = PointCloud::hasScanPos(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,"vertex",&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_608,"sx",&local_609);
    PLYReader::setReceiver
              (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
               &in_stack_fffffffffffff1f8->filename,
               (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
    std::__cxx11::string::~string(local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_630,"vertex",&local_631);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_658,"sy",&local_659);
    PLYReader::setReceiver
              (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
               &in_stack_fffffffffffff1f8->filename,
               (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
    std::__cxx11::string::~string(local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    std::__cxx11::string::~string(local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_680,"vertex",&local_681);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6a8,"sz",&local_6a9);
    PLYReader::setReceiver
              (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
               &in_stack_fffffffffffff1f8->filename,
               (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
    std::__cxx11::string::~string(local_6a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
    std::__cxx11::string::~string(local_680);
    std::allocator<char>::~allocator((allocator<char> *)&local_681);
  }
  Mesh::getNormalArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  Mesh::getNormalArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  Mesh::getNormalArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff200,(float *)in_stack_fffffffffffff1f8,
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             (size_t)in_stack_fffffffffffff1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_730,"vertex",&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_758,"nx",&local_759);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"vertex",&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a8,"ny",&local_7a9);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d0,"vertex",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"nz",&local_7f9);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"face",&local_821);
  uVar9 = PLYReader::instancesOfElement
                    (in_stack_fffffffffffff1f8,
                     (string *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  local_800 = (int)uVar9;
  (*(in_RDI->super_PointCloud).super_Model._vptr_Model[10])(in_RDI,uVar9 & 0xffffffff);
  TriangleReceiver::TriangleReceiver
            ((TriangleReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
             &in_stack_fffffffffffff1e8->super_Mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"face",&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"vertex_index",&local_881);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a8,"face",&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"vertex_indices",&local_8d1);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  MultiTextureCoordReceiver::MultiTextureCoordReceiver
            ((MultiTextureCoordReceiver *)
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),in_stack_fffffffffffff1e8
            );
  MultiTextureIndexReceiver::MultiTextureIndexReceiver
            ((MultiTextureIndexReceiver *)
             CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),in_stack_fffffffffffff1e8
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_918,"face",&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_940,"texcoord",&local_941);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator((allocator<char> *)&local_941);
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_968,"face",&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_990,"texnumber",&local_991);
  PLYReader::setReceiver
            (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
             &in_stack_fffffffffffff1f8->filename,
             (PLYReceiver *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0));
  std::__cxx11::string::~string(local_990);
  std::allocator<char>::~allocator((allocator<char> *)&local_991);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  PLYReader::readData(in_stack_fffffffffffff200);
  this_01 = local_10;
  std::allocator<char>::allocator();
  local_a0a = 0;
  local_a0b = 0;
  local_a32 = 0;
  local_a33 = 0;
  local_a5a = 0;
  local_a5b = 0;
  bVar1 = false;
  bVar2 = false;
  std::__cxx11::string::string(local_9b8,"vertex",&local_9b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e0,"nx",&local_9e1);
  pVar4 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                     &in_stack_fffffffffffff1f8->filename);
  local_dcd = true;
  if (pVar4 != ply_none) {
    std::allocator<char>::allocator();
    local_a0a = 1;
    std::__cxx11::string::string(local_a08,"vertex",&local_a09);
    local_a0b = 1;
    std::allocator<char>::allocator();
    local_a32 = 1;
    std::__cxx11::string::string(local_a30,"ny",&local_a31);
    local_a33 = 1;
    pVar4 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->filename,
                       &in_stack_fffffffffffff1f8->filename);
    local_dcd = true;
    if (pVar4 != ply_none) {
      this_00 = (PLYReader *)local_a59;
      std::allocator<char>::allocator();
      local_a5a = 1;
      std::__cxx11::string::string((string *)(local_a59 + 1),"vertex",(allocator *)this_00);
      local_a5b = 1;
      paVar11 = &local_a81;
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string(local_a80,"nz",paVar11);
      bVar2 = true;
      in_stack_fffffffffffff1f4 =
           PLYReader::getTypeOfProperty(this_00,&local_10->filename,(string *)paVar11);
      local_dcd = in_stack_fffffffffffff1f4 == ply_none;
      in_stack_fffffffffffff200 = local_10;
    }
  }
  uVar10 = CONCAT13(local_dcd,(int3)in_stack_fffffffffffff1f0);
  if (bVar2) {
    std::__cxx11::string::~string(local_a80);
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a81);
  }
  if ((local_a5b & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_a59 + 1));
  }
  if ((local_a5a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_a59);
  }
  if ((local_a33 & 1) != 0) {
    std::__cxx11::string::~string(local_a30);
  }
  if ((local_a32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  }
  if ((local_a0b & 1) != 0) {
    std::__cxx11::string::~string(local_a08);
  }
  if ((local_a0a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a09);
  }
  std::__cxx11::string::~string(local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  if ((uVar10 & 0x1000000) == 0) {
    Mesh::normalizeNormals((Mesh *)CONCAT44(in_stack_fffffffffffff1f4,uVar10));
  }
  else {
    Mesh::recalculateNormals((Mesh *)this_01);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff200);
  return;
}

Assistant:

void MultiTexturedMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  basepath=ply.getName();

  size_t j=basepath.find_last_of("/\\");

  if (j != basepath.npos)
  {
    basepath=basepath.substr(0, j+1);
  }
  else
  {
    basepath="";
  }

  // get names of textures

  std::vector<std::string> comment;
  ply.getComments(comment);

  resizeTextureList(0);

  for (size_t i=0; i<comment.size(); i++)
  {
    size_t k=comment[i].find("TextureFile");

    if (k != 0)
    {
      k=comment[i].find("texturefile");
    }

    if (k == 0)
    {
      std::string s=comment[i].substr(11);
      gutil::trim(s);

      resizeTextureList(getTextureCount()+1);
      setTextureName(getTextureCount()-1, s);
    }
  }

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  MultiTextureCoordReceiver tc(*this);
  MultiTextureIndexReceiver ti(*this);

  ply.setReceiver("face", "texcoord", &tc);
  ply.setReceiver("face", "texnumber", &ti);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}